

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double fisk_sample(double a,double b,double c,int *seed)

{
  double dVar1;
  double x;
  double cdf;
  int *seed_local;
  double c_local;
  double b_local;
  double a_local;
  
  dVar1 = r8_uniform_01(seed);
  dVar1 = fisk_cdf_inv(dVar1,a,b,c);
  return dVar1;
}

Assistant:

double fisk_sample ( double a, double b, double c, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    FISK_SAMPLE samples the Fisk PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, C, the parameters of the PDF.
//    0.0 < B,
//    0.0 < C.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double FISK_SAMPLE, a sample of the PDF.
//
{
  double cdf;
  double x;

  cdf = r8_uniform_01 ( seed );

  x = fisk_cdf_inv ( cdf, a, b, c );

  return x;
}